

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cc
# Opt level: O2

string * __thiscall
kratos::VarVarSlice::to_string_abi_cxx11_(string *__return_storage_ptr__,VarVarSlice *this)

{
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  basic_string_view<char> bVar1;
  format_args args;
  string_view format_str;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_38;
  undefined8 uStack_30;
  
  (*(((this->super_VarSlice).parent_var)->super_IRNode)._vptr_IRNode[0x1f])(&local_58);
  (*(this->sliced_var_->super_IRNode)._vptr_IRNode[0x1f])(&local_38);
  local_78 = local_58;
  uStack_70 = uStack_50;
  local_68 = local_38;
  uStack_60 = uStack_30;
  bVar1 = fmt::v7::to_string_view<char,_0>("{0}[{1}]");
  format_str.data_ = (char *)bVar1.size_;
  args.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .field_1.args_ = in_R9.args_;
  args.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .desc_ = (unsigned_long_long)&local_78;
  format_str.size_ = 0xdd;
  fmt::v7::detail::vformat_abi_cxx11_(__return_storage_ptr__,(detail *)bVar1.data_,format_str,args);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&local_58);
  return __return_storage_ptr__;
}

Assistant:

std::string VarVarSlice::to_string() const {
    return ::format("{0}[{1}]", parent_var->to_string(), sliced_var_->to_string());
}